

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void update_keyframe_counters(AV1_COMP *cpi)

{
  long *in_RDI;
  FIRSTPASS_INFO *firstpass_info;
  FIRSTPASS_INFO *in_stack_ffffffffffffffe8;
  
  if (((int)in_RDI[0x782c] != 0) && (*(int *)((long)in_RDI + 0x6079c) != 0)) {
    if (*(int *)(*in_RDI + 0x89e4) < 2) {
      av1_firstpass_info_move_cur_index((FIRSTPASS_INFO *)(*in_RDI + 0x5d60));
    }
    else {
      av1_firstpass_info_move_cur_index_and_pop(in_stack_ffffffffffffffe8);
    }
    if ((int)in_RDI[0x13a66] == (int)in_RDI[0x13a67] + -1) {
      *(int *)(in_RDI + 0xc0f4) = (int)in_RDI[0xc0f4] + 1;
      *(int *)((long)in_RDI + 0x6079c) = *(int *)((long)in_RDI + 0x6079c) + -1;
      *(int *)((long)in_RDI + 0x607a4) = *(int *)((long)in_RDI + 0x607a4) + -1;
      *(int *)((long)in_RDI + 0x607e4) = *(int *)((long)in_RDI + 0x607e4) + 1;
    }
  }
  return;
}

Assistant:

static inline void update_keyframe_counters(AV1_COMP *cpi) {
  if (cpi->common.show_frame && cpi->rc.frames_to_key) {
#if !CONFIG_REALTIME_ONLY
    FIRSTPASS_INFO *firstpass_info = &cpi->ppi->twopass.firstpass_info;
    if (firstpass_info->past_stats_count > FIRSTPASS_INFO_STATS_PAST_MIN) {
      av1_firstpass_info_move_cur_index_and_pop(firstpass_info);
    } else {
      // When there is not enough past stats, we move the current
      // index without popping the past stats
      av1_firstpass_info_move_cur_index(firstpass_info);
    }
#endif
    if (cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
      cpi->rc.frames_since_key++;
      cpi->rc.frames_to_key--;
      cpi->rc.frames_to_fwd_kf--;
      cpi->rc.frames_since_scene_change++;
    }
  }
}